

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
          (TextureRenderer *this,int texUnit,float *texCoord,RenderParams *params)

{
  string *psVar1;
  SamplerType SVar2;
  code *pcVar3;
  uint uVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  deUint32 err;
  undefined4 extraout_var;
  ShaderProgram *shaderProgram;
  MessageBuilder *pMVar8;
  long lVar9;
  Program program;
  uint uVar10;
  int local_270;
  allocator<char> local_266;
  allocator<char> local_265;
  uint local_264;
  ulong local_260;
  Vec4 wCoord;
  float local_248;
  float local_244;
  undefined4 local_240;
  float local_23c;
  float local_238;
  float local_234;
  undefined4 local_230;
  float local_22c [2];
  float local_224;
  undefined4 local_220;
  float local_21c;
  float local_218;
  float local_214;
  undefined4 local_210;
  float local_20c;
  Vec4 *local_208;
  float *local_200;
  undefined1 local_1f8 [32];
  string local_1d8;
  VertexArrayBinding vertexArrays [2];
  
  local_260 = CONCAT44(local_260._4_4_,texUnit);
  local_200 = texCoord;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  if ((params->flags & 1) == 0) {
    tcu::Vector<float,_4>::Vector(&wCoord,1.0);
  }
  else {
    tcu::Vector<float,_4>::Vector(&wCoord,&params->w);
  }
  local_264 = params->flags;
  local_248 = -wCoord.m_data[0];
  local_240 = 0;
  local_23c = wCoord.m_data[0];
  local_230 = 0;
  local_234 = wCoord.m_data[1];
  local_238 = -local_234;
  local_22c[0] = wCoord.m_data[1];
  local_22c[1] = wCoord.m_data[2];
  local_21c = wCoord.m_data[2];
  local_224 = -local_21c;
  local_220 = 0;
  uVar10 = local_264 & 2;
  local_218 = wCoord.m_data[3];
  local_214 = wCoord.m_data[3];
  local_210 = 0;
  local_20c = wCoord.m_data[3];
  program = PROGRAM_LAST;
  local_270 = 3;
  switch(params->texType) {
  case TEXTURETYPE_2D:
    local_270 = 2;
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      program = uVar10 * 2;
      break;
    case SAMPLERTYPE_INT:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_2D_INT;
      break;
    case SAMPLERTYPE_UINT:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_2D_UINT;
      break;
    case SAMPLERTYPE_SHADOW:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_2D_SHADOW;
    }
    break;
  case TEXTURETYPE_CUBE:
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_CUBE_FLOAT;
      break;
    case SAMPLERTYPE_INT:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_CUBE_INT;
      break;
    case SAMPLERTYPE_UINT:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_CUBE_UINT;
      break;
    case SAMPLERTYPE_SHADOW:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_CUBE_SHADOW;
    }
    break;
  case TEXTURETYPE_2D_ARRAY:
    if (params->samplerType < SAMPLERTYPE_FETCH_FLOAT) {
      program = params->samplerType + 0x1c;
    }
    break;
  case TEXTURETYPE_3D:
    SVar2 = params->samplerType;
    if (SVar2 == SAMPLERTYPE_UINT) {
      program = (uint)(uVar10 != 0) * 3 + PROGRAM_3D_UINT;
    }
    else if (SVar2 == SAMPLERTYPE_INT) {
      program = (uint)(uVar10 != 0) * 3 + PROGRAM_3D_INT;
    }
    else if (SVar2 == SAMPLERTYPE_FLOAT) {
      program = (uint)(uVar10 != 0) * 3 + PROGRAM_3D_FLOAT;
    }
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    if (params->samplerType < SAMPLERTYPE_FETCH_FLOAT) {
      program = params->samplerType + 0x26;
    }
    local_270 = 4;
    break;
  case TEXTURETYPE_1D:
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_1D_FLOAT;
      break;
    case SAMPLERTYPE_INT:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_1D_INT;
      break;
    case SAMPLERTYPE_UINT:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_1D_UINT;
      break;
    case SAMPLERTYPE_SHADOW:
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_1D_SHADOW;
    }
    goto switchD_006cfeed_default;
  case TEXTURETYPE_1D_ARRAY:
    local_270 = 2;
    if (params->samplerType < SAMPLERTYPE_FETCH_FLOAT) {
      program = params->samplerType + 0x18;
    }
    break;
  case TEXTURETYPE_BUFFER:
    if (params->samplerType - SAMPLERTYPE_FETCH_FLOAT < 3) {
      program = params->samplerType + 0x26;
    }
switchD_006cfeed_default:
    local_270 = 1;
    break;
  default:
    local_270 = 0;
  }
  local_244 = local_248;
  shaderProgram = ProgramLibrary::getProgram(&this->m_programLibrary,program);
  if ((params->flags & 4) != 0) {
    glu::operator<<(this->m_log,shaderProgram);
  }
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"Set vertex attributes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureTestUtil.cpp"
                  ,0x1b6);
  dVar6 = (shaderProgram->m_program).m_program;
  (**(code **)(lVar9 + 0x1680))(dVar6);
  pcVar3 = *(code **)(lVar9 + 0x14f0);
  uVar7 = (**(code **)(lVar9 + 0xb48))(dVar6,"u_sampler");
  (*pcVar3)(uVar7,local_260 & 0xffffffff);
  uVar4 = local_264;
  if ((local_264 & 8) != 0) {
    vertexArrays[0].binding._0_8_ = this->m_log;
    psVar1 = &vertexArrays[0].binding.name;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"u_sampler = ");
    std::ostream::operator<<(psVar1,(int)local_260);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)vertexArrays,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  }
  if (uVar10 != 0) {
    pcVar3 = *(code **)(lVar9 + 0x14e0);
    uVar7 = (**(code **)(lVar9 + 0xb48))(dVar6,"u_bias");
    (*pcVar3)(params->bias,uVar7);
    if ((uVar4 & 8) != 0) {
      vertexArrays[0].binding._0_8_ = this->m_log;
      psVar1 = &vertexArrays[0].binding.name;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
      std::operator<<((ostream *)psVar1,"u_bias = ");
      pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)vertexArrays,&params->bias);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
    }
  }
  if (params->samplerType == SAMPLERTYPE_SHADOW) {
    pcVar3 = *(code **)(lVar9 + 0x14e0);
    uVar7 = (**(code **)(lVar9 + 0xb48))(dVar6,"u_ref");
    (*pcVar3)(params->ref,uVar7);
    if ((uVar4 & 8) != 0) {
      vertexArrays[0].binding._0_8_ = this->m_log;
      psVar1 = &vertexArrays[0].binding.name;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
      std::operator<<((ostream *)psVar1,"u_ref = ");
      pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)vertexArrays,&params->ref);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
    }
  }
  pcVar3 = *(code **)(lVar9 + 0x15a8);
  uVar7 = (**(code **)(lVar9 + 0xb48))(dVar6,"u_colorScale");
  local_208 = &params->colorScale;
  (*pcVar3)(uVar7,1);
  pcVar3 = *(code **)(lVar9 + 0x15a8);
  local_260 = lVar9;
  uVar7 = (**(code **)(lVar9 + 0xb48))(dVar6,"u_colorBias");
  (*pcVar3)(uVar7,1,&params->colorBias);
  if ((local_264 & 8) != 0) {
    vertexArrays[0].binding._0_8_ = this->m_log;
    psVar1 = &vertexArrays[0].binding.name;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"u_colorScale = ");
    tcu::operator<<((ostream *)psVar1,local_208);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)vertexArrays,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
    vertexArrays[0].binding._0_8_ = this->m_log;
    psVar1 = &vertexArrays[0].binding.name;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"u_colorBias = ");
    tcu::operator<<((ostream *)psVar1,&params->colorBias);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)vertexArrays,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  }
  err = (**(code **)(local_260 + 0x800))();
  glu::checkError(err,"Set program state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureTestUtil.cpp"
                  ,0x1d7);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1f8,"a_position",&local_265);
  glu::va::Float(vertexArrays,(string *)local_1f8,4,4,0,&local_248);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"a_texCoord",&local_266);
  glu::va::Float(vertexArrays + 1,&local_1d8,local_270,4,0,local_200);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)local_1f8);
  local_1f8._0_8_ = (pointer)0x600000000;
  local_1f8._8_4_ = INDEXTYPE_UINT16;
  local_1f8._16_8_ = renderQuad::indices;
  glu::draw(this->m_renderCtx,dVar6,2,vertexArrays,(PrimitiveList *)local_1f8,
            (DrawUtilCallback *)0x0);
  lVar9 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar9));
    lVar9 = lVar9 + -0x50;
  } while (lVar9 != -0x48);
  return;
}

Assistant:

void TextureRenderer::renderQuad (int texUnit, const float* texCoord, const RenderParams& params)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	tcu::Vec4				wCoord		= params.flags & RenderParams::PROJECTED ? params.w : tcu::Vec4(1.0f);
	bool					useBias		= !!(params.flags & RenderParams::USE_BIAS);
	bool					logUniforms	= !!(params.flags & RenderParams::LOG_UNIFORMS);

	// Render quad with texture.
	float position[] =
	{
		-1.0f*wCoord.x(), -1.0f*wCoord.x(), 0.0f, wCoord.x(),
		-1.0f*wCoord.y(), +1.0f*wCoord.y(), 0.0f, wCoord.y(),
		+1.0f*wCoord.z(), -1.0f*wCoord.z(), 0.0f, wCoord.z(),
		+1.0f*wCoord.w(), +1.0f*wCoord.w(), 0.0f, wCoord.w()
	};
	static const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

	Program progSpec	= PROGRAM_LAST;
	int		numComps	= 0;
	if (params.texType == TEXTURETYPE_2D)
	{
		numComps = 2;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_2D_FLOAT_BIAS	: PROGRAM_2D_FLOAT;		break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_2D_INT_BIAS	: PROGRAM_2D_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_2D_UINT_BIAS	: PROGRAM_2D_UINT;		break;
			case SAMPLERTYPE_SHADOW:	progSpec = useBias ? PROGRAM_2D_SHADOW_BIAS	: PROGRAM_2D_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_1D)
	{
		numComps = 1;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_1D_FLOAT_BIAS	: PROGRAM_1D_FLOAT;		break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_1D_INT_BIAS	: PROGRAM_1D_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_1D_UINT_BIAS	: PROGRAM_1D_UINT;		break;
			case SAMPLERTYPE_SHADOW:	progSpec = useBias ? PROGRAM_1D_SHADOW_BIAS	: PROGRAM_1D_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_CUBE)
	{
		numComps = 3;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_CUBE_FLOAT_BIAS	: PROGRAM_CUBE_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_CUBE_INT_BIAS		: PROGRAM_CUBE_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_CUBE_UINT_BIAS		: PROGRAM_CUBE_UINT;	break;
			case SAMPLERTYPE_SHADOW:	progSpec = useBias ? PROGRAM_CUBE_SHADOW_BIAS	: PROGRAM_CUBE_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_3D)
	{
		numComps = 3;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_3D_FLOAT_BIAS	: PROGRAM_3D_FLOAT;		break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_3D_INT_BIAS	: PROGRAM_3D_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_3D_UINT_BIAS	: PROGRAM_3D_UINT;		break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_2D_ARRAY)
	{
		DE_ASSERT(!useBias); // \todo [2012-02-17 pyry] Support bias.

		numComps = 3;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = PROGRAM_2D_ARRAY_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = PROGRAM_2D_ARRAY_INT;	break;
			case SAMPLERTYPE_UINT:		progSpec = PROGRAM_2D_ARRAY_UINT;	break;
			case SAMPLERTYPE_SHADOW:	progSpec = PROGRAM_2D_ARRAY_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_CUBE_ARRAY)
	{
		DE_ASSERT(!useBias);

		numComps = 4;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = PROGRAM_CUBE_ARRAY_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = PROGRAM_CUBE_ARRAY_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = PROGRAM_CUBE_ARRAY_UINT;		break;
			case SAMPLERTYPE_SHADOW:	progSpec = PROGRAM_CUBE_ARRAY_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_1D_ARRAY)
	{
		DE_ASSERT(!useBias); // \todo [2012-02-17 pyry] Support bias.

		numComps = 2;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = PROGRAM_1D_ARRAY_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = PROGRAM_1D_ARRAY_INT;	break;
			case SAMPLERTYPE_UINT:		progSpec = PROGRAM_1D_ARRAY_UINT;	break;
			case SAMPLERTYPE_SHADOW:	progSpec = PROGRAM_1D_ARRAY_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_BUFFER)
	{
		numComps = 1;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FETCH_FLOAT:	progSpec = PROGRAM_BUFFER_FLOAT;	break;
			case SAMPLERTYPE_FETCH_INT:		progSpec = PROGRAM_BUFFER_INT;		break;
			case SAMPLERTYPE_FETCH_UINT:	progSpec = PROGRAM_BUFFER_UINT;		break;
			default:						DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(DE_FALSE);

	glu::ShaderProgram* program = m_programLibrary.getProgram(progSpec);

	// \todo [2012-09-26 pyry] Move to ProgramLibrary and log unique programs only(?)
	if (params.flags & RenderParams::LOG_PROGRAMS)
		m_log << *program;

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set vertex attributes");

	// Program and uniforms.
	deUint32 prog = program->getProgram();
	gl.useProgram(prog);

	gl.uniform1i(gl.getUniformLocation(prog, "u_sampler"), texUnit);
	if (logUniforms)
		m_log << TestLog::Message << "u_sampler = " << texUnit << TestLog::EndMessage;

	if (useBias)
	{
		gl.uniform1f(gl.getUniformLocation(prog, "u_bias"), params.bias);
		if (logUniforms)
			m_log << TestLog::Message << "u_bias = " << params.bias << TestLog::EndMessage;
	}

	if (params.samplerType == SAMPLERTYPE_SHADOW)
	{
		gl.uniform1f(gl.getUniformLocation(prog, "u_ref"), params.ref);
		if (logUniforms)
			m_log << TestLog::Message << "u_ref = " << params.ref << TestLog::EndMessage;
	}

	gl.uniform4fv(gl.getUniformLocation(prog, "u_colorScale"),	1, params.colorScale.getPtr());
	gl.uniform4fv(gl.getUniformLocation(prog, "u_colorBias"),	1, params.colorBias.getPtr());

	if (logUniforms)
	{
		m_log << TestLog::Message << "u_colorScale = " << params.colorScale << TestLog::EndMessage;
		m_log << TestLog::Message << "u_colorBias = " << params.colorBias << TestLog::EndMessage;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set program state");

	{
		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	4,			4, 0, &position[0]),
			glu::va::Float("a_texCoord",	numComps,	4, 0, texCoord)
		};
		glu::draw(m_renderCtx, prog, DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
	}
}